

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolidShapes.cpp
# Opt level: O1

void __thiscall iDynTree::SolidShape::SolidShape(SolidShape *this)

{
  this->_vptr_SolidShape = (_func_int **)&PTR___cxa_pure_virtual_00185618;
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  this->nameIsValid = false;
  iDynTree::Transform::Identity();
  this->m_isMaterialSet = false;
  Material::Material(&this->m_material);
  return;
}

Assistant:

SolidShape::SolidShape()
        : nameIsValid(false)
        , link_H_geometry(iDynTree::Transform::Identity())
        , m_isMaterialSet(false)
    {
    }